

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O0

CScript * __thiscall CScript::operator<<(CScript *this,opcodetype opcode)

{
  long lVar1;
  runtime_error *this_00;
  int in_ESI;
  CScript *in_RDI;
  long in_FS_OFFSET;
  iterator unaff_retaddr;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *in_stack_ffffffffffffffb0;
  undefined1 local_1c;
  CScript *value;
  undefined7 in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI < 0) || (0xff < in_ESI)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"CScript::operator<<(): invalid opcode");
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    value = in_RDI;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::end(in_stack_ffffffffffffffb0);
    local_1c = (undefined1)in_ESI;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT17(local_1c,in_stack_fffffffffffffff0),unaff_retaddr,(uchar *)value);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return in_RDI;
    }
  }
  __stack_chk_fail();
}

Assistant:

CScript& operator<<(opcodetype opcode) LIFETIMEBOUND
    {
        if (opcode < 0 || opcode > 0xff)
            throw std::runtime_error("CScript::operator<<(): invalid opcode");
        insert(end(), (unsigned char)opcode);
        return *this;
    }